

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WScriptJsrt.cpp
# Opt level: O0

void __thiscall WScriptJsrt::CallbackMessage::~CallbackMessage(CallbackMessage *this)

{
  JsErrorCode JVar1;
  PAL_FILE *pPVar2;
  bool local_11;
  JsErrorCode errorCode;
  bool hasException;
  CallbackMessage *this_local;
  
  (this->super_MessageBase)._vptr_MessageBase = (_func_int **)&PTR__CallbackMessage_001d2228;
  local_11 = false;
  _errorCode = this;
  ChakraRTInterface::JsHasException(&local_11);
  if ((local_11 & 1U) != 0) {
    PrintException("",JsErrorScriptException,(JsValueRef)0x0);
  }
  JVar1 = ChakraRTInterface::JsRelease(this->m_function,(uint *)0x0);
  if (JVar1 != JsNoError) {
    pPVar2 = PAL_get_stderr(0);
    PAL_fprintf(pPVar2,"ASSERTION (%s, line %d) %s %s\n",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/bin/ch/WScriptJsrt.cpp"
                ,0x7b6,"errorCode == JsNoError");
    pPVar2 = PAL_get_stderr(0);
    PAL_fflush(pPVar2);
    DebugBreak();
  }
  this->m_function = (JsValueRef)0x0;
  MessageBase::~MessageBase(&this->super_MessageBase);
  return;
}

Assistant:

WScriptJsrt::CallbackMessage::~CallbackMessage()
{
    bool hasException = false;
    ChakraRTInterface::JsHasException(&hasException);
    if (hasException)
    {
        WScriptJsrt::PrintException("", JsErrorScriptException);
    }
    JsErrorCode errorCode = ChakraRTInterface::JsRelease(m_function, nullptr);
    Assert(errorCode == JsNoError);
    m_function = JS_INVALID_REFERENCE;
}